

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS
ref_cell_list_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT max_cell,REF_INT *ncell,
                   REF_INT *cell_list)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  *ncell = 0;
  iVar5 = -1;
  uVar6 = 0xffffffff;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    uVar6 = 0xffffffff;
    iVar5 = -1;
    if (node0 < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node0];
      uVar6 = 0xffffffff;
      iVar5 = -1;
      if ((long)(int)uVar1 != -1) {
        iVar5 = pRVar2->item[(int)uVar1].ref;
        uVar6 = (ulong)uVar1;
      }
    }
  }
  iVar4 = 0;
  do {
    if ((int)uVar6 == -1) {
      return 0;
    }
    for (lVar7 = 0; (int)lVar7 < ref_cell->node_per; lVar7 = lVar7 + 1) {
      if (ref_cell->c2n[(long)ref_cell->size_per * (long)iVar5 + lVar7] == node1) {
        if (max_cell <= iVar4) {
          return 7;
        }
        cell_list[iVar4] = iVar5;
        iVar4 = *ncell + 1;
        *ncell = iVar4;
      }
    }
    pRVar3 = ref_cell->ref_adj->item;
    uVar6 = (ulong)pRVar3[(int)uVar6].next;
    iVar5 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      iVar5 = pRVar3[uVar6].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_list_with2(REF_CELL ref_cell, REF_INT node0,
                                       REF_INT node1, REF_INT max_cell,
                                       REF_INT *ncell, REF_INT *cell_list) {
  REF_INT cell, item, cell_node;

  *ncell = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    if (*ncell >= max_cell) return REF_INCREASE_LIMIT;
    cell_list[*ncell] = cell;
    (*ncell)++;
  }

  return REF_SUCCESS;
}